

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  byte bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined8 uVar16;
  undefined8 uVar17;
  ulong uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  long lVar24;
  long lVar25;
  unsigned_long uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar48 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined4 uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar75;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar76;
  undefined1 auVar77 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar79;
  undefined1 auVar80 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined4 uVar84;
  undefined4 uVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  size_t local_250;
  size_t local_248;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar28 = r->_begin;
  uVar26 = r->_end;
  if (uVar28 < uVar26) {
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    auVar90 = ZEXT1664(auVar34);
    auVar47._8_4_ = 0x7f800000;
    auVar47._0_8_ = 0x7f8000007f800000;
    auVar47._12_4_ = 0x7f800000;
    auVar71 = ZEXT1664(auVar47);
    auVar73._8_4_ = 0x7fffffff;
    auVar73._0_8_ = 0x7fffffff7fffffff;
    auVar73._12_4_ = 0x7fffffff;
    auVar74._8_4_ = 0xddccb9a2;
    auVar74._0_8_ = 0xddccb9a2ddccb9a2;
    auVar74._12_4_ = 0xddccb9a2;
    local_250 = 0;
    auVar81._8_4_ = 0x5dccb9a2;
    auVar81._0_8_ = 0x5dccb9a25dccb9a2;
    auVar81._12_4_ = 0x5dccb9a2;
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar92 = ZEXT1664(auVar35);
    auVar48 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar89 = ZEXT3264(auVar48);
    auVar77 = ZEXT1664(auVar47);
    auVar80 = ZEXT1664(auVar34);
    local_248 = k;
    do {
      pBVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
               vertices.items;
      uVar1 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                  super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar28);
      uVar30 = (ulong)(uVar1 + 3);
      if (uVar30 < (pBVar2->super_RawBufferView).num) {
        lVar27 = 0;
        do {
          lVar31 = *(long *)((long)&(pBVar2->super_RawBufferView).ptr_ofs + lVar27);
          lVar32 = *(long *)((long)&(pBVar2->super_RawBufferView).stride + lVar27);
          lVar29 = lVar32 * (ulong)uVar1;
          auVar34 = vandps_avx(ZEXT416(*(uint *)(lVar31 + 0xc + lVar29)),auVar73);
          if (1.844e+18 <= auVar34._0_4_) goto LAB_01edcd42;
          lVar24 = lVar32 * (ulong)(uVar1 + 1);
          auVar34 = vandps_avx(ZEXT416(*(uint *)(lVar31 + 0xc + lVar24)),auVar73);
          if (1.844e+18 <= auVar34._0_4_) goto LAB_01edcd42;
          lVar25 = lVar32 * (ulong)(uVar1 + 2);
          auVar34 = vandps_avx(ZEXT416(*(uint *)(lVar31 + 0xc + lVar25)),auVar73);
          if (1.844e+18 <= auVar34._0_4_) goto LAB_01edcd42;
          auVar34 = vandps_avx(ZEXT416(*(uint *)(lVar31 + 0xc + lVar32 * uVar30)),auVar73);
          if (1.844e+18 <= auVar34._0_4_) goto LAB_01edcd42;
          auVar34 = *(undefined1 (*) [16])(lVar31 + lVar29);
          uVar16 = vcmpps_avx512vl(auVar34,auVar74,6);
          uVar17 = vcmpps_avx512vl(auVar34,auVar81,1);
          if ((~((ushort)uVar16 & (ushort)uVar17) & 7) != 0) goto LAB_01edcd42;
          auVar34 = *(undefined1 (*) [16])(lVar31 + lVar24);
          uVar16 = vcmpps_avx512vl(auVar34,auVar74,6);
          uVar17 = vcmpps_avx512vl(auVar34,auVar81,1);
          if ((~((ushort)uVar16 & (ushort)uVar17) & 7) != 0) goto LAB_01edcd42;
          auVar34 = *(undefined1 (*) [16])(lVar31 + lVar25);
          uVar16 = vcmpps_avx512vl(auVar34,auVar74,6);
          uVar17 = vcmpps_avx512vl(auVar34,auVar81,1);
          if ((~((ushort)uVar16 & (ushort)uVar17) & 7) != 0) goto LAB_01edcd42;
          auVar34 = *(undefined1 (*) [16])(lVar31 + lVar32 * uVar30);
          uVar16 = vcmpps_avx512vl(auVar34,auVar74,6);
          uVar17 = vcmpps_avx512vl(auVar34,auVar81,1);
          if ((~((ushort)uVar16 & (ushort)uVar17) & 7) != 0) goto LAB_01edcd42;
          lVar27 = lVar27 + 0x38;
        } while ((ulong)((this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1) * 0x38 + 0x38 !=
                 lVar27);
        pcVar3 = (pBVar2->super_RawBufferView).ptr_ofs;
        sVar4 = (pBVar2->super_RawBufferView).stride;
        lVar27 = uVar1 * sVar4;
        auVar34 = *(undefined1 (*) [16])(pcVar3 + lVar27);
        lVar31 = (uVar1 + 1) * sVar4;
        auVar35 = *(undefined1 (*) [16])(pcVar3 + lVar31);
        lVar32 = (uVar1 + 2) * sVar4;
        auVar47 = *(undefined1 (*) [16])(pcVar3 + lVar32);
        auVar46 = *(undefined1 (*) [16])(pcVar3 + uVar30 * sVar4);
        fVar72 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 maxRadiusScale;
        auVar36 = vmulss_avx512f(ZEXT416((uint)fVar72),ZEXT416(*(uint *)(pcVar3 + lVar27 + 0xc)));
        fVar11 = fVar72 * *(float *)(pcVar3 + lVar31 + 0xc);
        fVar12 = fVar72 * *(float *)(pcVar3 + lVar32 + 0xc);
        fVar72 = fVar72 * *(float *)(pcVar3 + uVar30 * sVar4 + 0xc);
        uVar1 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                tessellationRate;
        uVar30 = (ulong)uVar1;
        if (uVar30 == 4) {
          auVar69._4_4_ = fVar72;
          auVar69._0_4_ = fVar72;
          auVar69._8_4_ = fVar72;
          auVar69._12_4_ = fVar72;
          auVar7 = vblendps_avx(auVar46,auVar69,8);
          auVar82._4_4_ = fVar12;
          auVar82._0_4_ = fVar12;
          auVar82._8_4_ = fVar12;
          auVar82._12_4_ = fVar12;
          auVar83 = vblendps_avx(auVar47,auVar82,8);
          auVar86._4_4_ = fVar11;
          auVar86._0_4_ = fVar11;
          auVar86._8_4_ = fVar11;
          auVar86._12_4_ = fVar11;
          auVar8 = vblendps_avx(auVar35,auVar86,8);
          in_ZMM23 = ZEXT1664(bspline_basis0._272_16_);
          auVar37 = vbroadcastss_avx512vl(auVar34);
          auVar38 = vshufps_avx512vl(auVar34,auVar34,0x55);
          auVar39 = vshufps_avx512vl(auVar34,auVar34,0xaa);
          auVar36 = vbroadcastss_avx512vl(auVar36);
          auVar40 = vbroadcastss_avx512vl(auVar35);
          auVar41 = vshufps_avx512vl(auVar35,auVar35,0x55);
          auVar34 = vshufps_avx(auVar35,auVar35,0xaa);
          auVar42 = vbroadcastss_avx512vl(auVar47);
          auVar43 = vshufps_avx512vl(auVar47,auVar47,0x55);
          auVar35 = vshufps_avx(auVar47,auVar47,0xaa);
          auVar91 = auVar92._0_16_;
          auVar48 = vmovdqa64_avx512vl(auVar89._0_32_);
          auVar44 = vbroadcastss_avx512vl(auVar46);
          auVar45 = vshufps_avx512vl(auVar46,auVar46,0x55);
          auVar47 = vshufps_avx(auVar46,auVar46,0xaa);
          auVar46 = vmulps_avx512vl(auVar44,bspline_basis0._3740_16_);
          auVar44 = vmulps_avx512vl(auVar45,bspline_basis0._3740_16_);
          auVar47 = vmulps_avx512vl(auVar47,bspline_basis0._3740_16_);
          auVar45 = vmulps_avx512vl(auVar69,bspline_basis0._3740_16_);
          auVar48 = vmovdqa64_avx512vl(auVar48);
          auVar89 = ZEXT3264(auVar48);
          auVar92 = ZEXT1664(auVar91);
          auVar46 = vfmadd231ps_avx512vl(auVar46,bspline_basis0._2584_16_,auVar42);
          auVar42 = vfmadd231ps_avx512vl(auVar44,bspline_basis0._2584_16_,auVar43);
          auVar35 = vfmadd231ps_avx512vl(auVar47,bspline_basis0._2584_16_,auVar35);
          auVar47 = vfmadd231ps_avx512vl(auVar45,bspline_basis0._2584_16_,auVar82);
          auVar46 = vfmadd231ps_avx512vl(auVar46,bspline_basis0._1428_16_,auVar40);
          auVar40 = vfmadd231ps_avx512vl(auVar42,bspline_basis0._1428_16_,auVar41);
          auVar34 = vfmadd231ps_avx512vl(auVar35,bspline_basis0._1428_16_,auVar34);
          auVar35 = vfmadd231ps_avx512vl(auVar47,bspline_basis0._1428_16_,auVar86);
          auVar47 = vfmadd231ps_avx512vl(auVar46,bspline_basis0._272_16_,auVar37);
          auVar37 = vfmadd231ps_avx512vl(auVar40,bspline_basis0._272_16_,auVar38);
          auVar38 = vfmadd231ps_avx512vl(auVar34,bspline_basis0._272_16_,auVar39);
          auVar36 = vfmadd231ps_avx512vl(auVar35,bspline_basis0._272_16_,auVar36);
          auVar39 = vshufps_avx512vl(auVar47,auVar47,0xb1);
          auVar35 = vminps_avx512vl(auVar39,auVar47);
          auVar34 = vshufpd_avx(auVar35,auVar35,1);
          auVar34 = vminps_avx(auVar34,auVar35);
          auVar40 = vshufps_avx512vl(auVar37,auVar37,0xb1);
          auVar35 = vminps_avx512vl(auVar40,auVar37);
          auVar46 = vshufpd_avx512vl(auVar35,auVar35,1);
          auVar35 = vminps_avx512vl(auVar46,auVar35);
          auVar34 = vinsertps_avx(auVar34,auVar35,0x1c);
          auVar35 = vshufps_avx(auVar38,auVar38,0xb1);
          auVar46 = vminps_avx512vl(auVar35,auVar38);
          auVar41 = vshufpd_avx512vl(auVar46,auVar46,1);
          auVar46 = vminps_avx512vl(auVar41,auVar46);
          auVar46 = vinsertps_avx512f(auVar34,auVar46,0x20);
          auVar34 = vmaxps_avx512vl(auVar39,auVar47);
          auVar47 = vshufpd_avx512vl(auVar34,auVar34,1);
          auVar34 = vmaxps_avx512vl(auVar47,auVar34);
          auVar47 = vmaxps_avx512vl(auVar40,auVar37);
          auVar37 = vshufpd_avx512vl(auVar47,auVar47,1);
          auVar47 = vmaxps_avx512vl(auVar37,auVar47);
          auVar34 = vinsertps_avx(auVar34,auVar47,0x1c);
          auVar35 = vmaxps_avx(auVar35,auVar38);
          auVar47 = vshufpd_avx(auVar35,auVar35,1);
          auVar35 = vmaxps_avx(auVar47,auVar35);
          auVar34 = vinsertps_avx(auVar34,auVar35,0x20);
          auVar35 = vandps_avx512vl(auVar36,auVar91);
          auVar47 = vprolq_avx512vl(auVar35,0x20);
          auVar35 = vmaxps_avx(auVar47,auVar35);
          uVar68 = auVar35._0_4_;
          auVar37._4_4_ = uVar68;
          auVar37._0_4_ = uVar68;
          auVar37._8_4_ = uVar68;
          auVar37._12_4_ = uVar68;
          auVar35 = vshufps_avx(auVar35,auVar35,0xaa);
          auVar35 = vmaxps_avx(auVar35,auVar37);
          auVar39._8_4_ = 0x3e2aaaab;
          auVar39._0_8_ = 0x3e2aaaab3e2aaaab;
          auVar39._12_4_ = 0x3e2aaaab;
          local_218 = auVar7._0_4_;
          fStack_214 = auVar7._4_4_;
          fStack_210 = auVar7._8_4_;
          fStack_20c = auVar7._12_4_;
          auVar38._0_4_ = local_218 * 0.16666667;
          auVar38._4_4_ = fStack_214 * 0.16666667;
          auVar38._8_4_ = fStack_210 * 0.16666667;
          auVar38._12_4_ = fStack_20c * 0.16666667;
          auVar7._8_4_ = 0x3f2aaaab;
          auVar7._0_8_ = 0x3f2aaaab3f2aaaab;
          auVar7._12_4_ = 0x3f2aaaab;
          auVar47 = vfmadd231ps_avx512vl(auVar38,auVar83,auVar7);
          auVar36 = vfmadd231ps_fma(auVar47,auVar39,auVar8);
          auVar46 = vminps_avx(auVar46,auVar36);
          auVar47 = vmaxps_avx(auVar34,auVar36);
          auVar34 = vshufps_avx(auVar36,auVar36,0xff);
          auVar34 = vandps_avx512vl(auVar34,auVar91);
          auVar35 = vmaxps_avx(auVar35,auVar34);
          auVar34 = vsubps_avx(auVar46,auVar35);
          auVar46._0_4_ = auVar47._0_4_ + auVar35._0_4_;
          auVar46._4_4_ = auVar47._4_4_ + auVar35._4_4_;
          auVar46._8_4_ = auVar47._8_4_ + auVar35._8_4_;
          auVar46._12_4_ = auVar47._12_4_ + auVar35._12_4_;
        }
        else {
          if ((int)uVar1 < 0) {
            auVar34 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
            in_ZMM23 = ZEXT1664(auVar34);
            auVar62 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar67 = auVar61;
            auVar64 = auVar62;
            auVar48 = auVar62;
            auVar60 = auVar61;
          }
          else {
            auVar49 = vpbroadcastd_avx512vl();
            auVar50 = vbroadcastss_avx512vl(auVar34);
            auVar70._8_4_ = 1;
            auVar70._0_8_ = 0x100000001;
            auVar70._12_4_ = 1;
            auVar70._16_4_ = 1;
            auVar70._20_4_ = 1;
            auVar70._24_4_ = 1;
            auVar70._28_4_ = 1;
            auVar51 = vpermps_avx512vl(auVar70,ZEXT1632(auVar34));
            auVar87._8_4_ = 2;
            auVar87._0_8_ = 0x200000002;
            auVar87._12_4_ = 2;
            auVar87._16_4_ = 2;
            auVar87._20_4_ = 2;
            auVar87._24_4_ = 2;
            auVar87._28_4_ = 2;
            auVar52 = vpermps_avx512vl(auVar87,ZEXT1632(auVar34));
            auVar53 = vbroadcastss_avx512vl(auVar36);
            uVar68 = auVar35._0_4_;
            auVar66 = vpermps_avx2(auVar70,ZEXT1632(auVar35));
            auVar13 = vpermps_avx2(auVar87,ZEXT1632(auVar35));
            uVar85 = auVar47._0_4_;
            auVar14 = vpermps_avx2(auVar70,ZEXT1632(auVar47));
            auVar15 = vpermps_avx2(auVar87,ZEXT1632(auVar47));
            uVar84 = auVar46._0_4_;
            auVar70 = vpermps_avx2(auVar70,ZEXT1632(auVar46));
            auVar87 = vpermps_avx2(auVar87,ZEXT1632(auVar46));
            lVar27 = uVar30 * 0x44;
            auVar88 = ZEXT864(0) << 0x20;
            uVar33 = 0;
            auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar56 = auVar55;
            auVar57 = auVar54;
            auVar58 = auVar54;
            auVar59 = auVar55;
            do {
              auVar48 = vpbroadcastd_avx512vl();
              auVar60 = vpord_avx512vl(auVar48,auVar89._0_32_);
              auVar48 = *(undefined1 (*) [32])(bspline_basis0 + uVar33 * 4 + lVar27);
              auVar67 = *(undefined1 (*) [32])(lVar27 + 0x21aefac + uVar33 * 4);
              auVar64 = *(undefined1 (*) [32])(lVar27 + 0x21af430 + uVar33 * 4);
              uVar18 = vpcmpgtd_avx512vl(auVar60,auVar49);
              auVar60 = *(undefined1 (*) [32])(lVar27 + 0x21af8b4 + uVar33 * 4);
              auVar19._4_4_ = uVar84;
              auVar19._0_4_ = uVar84;
              auVar19._8_4_ = uVar84;
              auVar19._12_4_ = uVar84;
              auVar19._16_4_ = uVar84;
              auVar19._20_4_ = uVar84;
              auVar19._24_4_ = uVar84;
              auVar19._28_4_ = uVar84;
              auVar61 = vmulps_avx512vl(auVar60,auVar19);
              auVar62 = vmulps_avx512vl(auVar60,auVar70);
              auVar63 = vmulps_avx512vl(auVar87,auVar60);
              auVar65._4_4_ = fVar72 * auVar60._4_4_;
              auVar65._0_4_ = fVar72 * auVar60._0_4_;
              auVar65._8_4_ = fVar72 * auVar60._8_4_;
              auVar65._12_4_ = fVar72 * auVar60._12_4_;
              auVar65._16_4_ = fVar72 * auVar60._16_4_;
              auVar65._20_4_ = fVar72 * auVar60._20_4_;
              auVar65._24_4_ = fVar72 * auVar60._24_4_;
              auVar65._28_4_ = auVar60._28_4_;
              auVar21._4_4_ = uVar85;
              auVar21._0_4_ = uVar85;
              auVar21._8_4_ = uVar85;
              auVar21._12_4_ = uVar85;
              auVar21._16_4_ = uVar85;
              auVar21._20_4_ = uVar85;
              auVar21._24_4_ = uVar85;
              auVar21._28_4_ = uVar85;
              auVar60 = vfmadd231ps_avx512vl(auVar61,auVar64,auVar21);
              auVar61 = vfmadd231ps_avx512vl(auVar62,auVar64,auVar14);
              auVar62 = vfmadd231ps_avx512vl(auVar63,auVar64,auVar15);
              auVar20._4_4_ = fVar12;
              auVar20._0_4_ = fVar12;
              auVar20._8_4_ = fVar12;
              auVar20._12_4_ = fVar12;
              auVar20._16_4_ = fVar12;
              auVar20._20_4_ = fVar12;
              auVar20._24_4_ = fVar12;
              auVar20._28_4_ = fVar12;
              auVar34 = vfmadd231ps_fma(auVar65,auVar64,auVar20);
              auVar23._4_4_ = uVar68;
              auVar23._0_4_ = uVar68;
              auVar23._8_4_ = uVar68;
              auVar23._12_4_ = uVar68;
              auVar23._16_4_ = uVar68;
              auVar23._20_4_ = uVar68;
              auVar23._24_4_ = uVar68;
              auVar23._28_4_ = uVar68;
              auVar64 = vfmadd231ps_avx512vl(auVar60,auVar67,auVar23);
              auVar60 = vfmadd231ps_avx512vl(auVar61,auVar67,auVar66);
              auVar61 = vfmadd231ps_avx512vl(auVar62,auVar67,auVar13);
              auVar22._4_4_ = fVar11;
              auVar22._0_4_ = fVar11;
              auVar22._8_4_ = fVar11;
              auVar22._12_4_ = fVar11;
              auVar22._16_4_ = fVar11;
              auVar22._20_4_ = fVar11;
              auVar22._24_4_ = fVar11;
              auVar22._28_4_ = fVar11;
              auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar67,auVar22);
              auVar64 = vfmadd231ps_avx512vl(auVar64,auVar48,auVar50);
              auVar62 = vfmadd231ps_avx512vl(auVar60,auVar48,auVar51);
              auVar65 = vfmadd231ps_avx512vl(auVar61,auVar48,auVar52);
              auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar48,auVar53);
              auVar63._8_4_ = 0x7fffffff;
              auVar63._0_8_ = 0x7fffffff7fffffff;
              auVar63._12_4_ = 0x7fffffff;
              auVar63._16_4_ = 0x7fffffff;
              auVar63._20_4_ = 0x7fffffff;
              auVar63._24_4_ = 0x7fffffff;
              auVar63._28_4_ = 0x7fffffff;
              vandps_avx512vl(ZEXT1632(auVar34),auVar63);
              auVar48 = vminps_avx512vl(auVar57,auVar64);
              bVar5 = (byte)uVar18;
              auVar61._0_4_ =
                   (uint)(bVar5 & 1) * auVar57._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar48._0_4_;
              bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
              auVar61._4_4_ = (uint)bVar6 * auVar57._4_4_ | (uint)!bVar6 * auVar48._4_4_;
              bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
              auVar61._8_4_ = (uint)bVar6 * auVar57._8_4_ | (uint)!bVar6 * auVar48._8_4_;
              bVar6 = (bool)((byte)(uVar18 >> 3) & 1);
              auVar61._12_4_ = (uint)bVar6 * auVar57._12_4_ | (uint)!bVar6 * auVar48._12_4_;
              bVar6 = (bool)((byte)(uVar18 >> 4) & 1);
              auVar61._16_4_ = (uint)bVar6 * auVar57._16_4_ | (uint)!bVar6 * auVar48._16_4_;
              bVar6 = (bool)((byte)(uVar18 >> 5) & 1);
              auVar61._20_4_ = (uint)bVar6 * auVar57._20_4_ | (uint)!bVar6 * auVar48._20_4_;
              bVar6 = (bool)((byte)(uVar18 >> 6) & 1);
              auVar61._24_4_ = (uint)bVar6 * auVar57._24_4_ | (uint)!bVar6 * auVar48._24_4_;
              bVar6 = SUB81(uVar18 >> 7,0);
              auVar61._28_4_ = (uint)bVar6 * auVar57._28_4_ | (uint)!bVar6 * auVar48._28_4_;
              auVar48 = vminps_avx512vl(auVar58,auVar62);
              auVar60._0_4_ =
                   (uint)(bVar5 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar48._0_4_;
              bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
              auVar60._4_4_ = (uint)bVar6 * auVar58._4_4_ | (uint)!bVar6 * auVar48._4_4_;
              bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
              auVar60._8_4_ = (uint)bVar6 * auVar58._8_4_ | (uint)!bVar6 * auVar48._8_4_;
              bVar6 = (bool)((byte)(uVar18 >> 3) & 1);
              auVar60._12_4_ = (uint)bVar6 * auVar58._12_4_ | (uint)!bVar6 * auVar48._12_4_;
              bVar6 = (bool)((byte)(uVar18 >> 4) & 1);
              auVar60._16_4_ = (uint)bVar6 * auVar58._16_4_ | (uint)!bVar6 * auVar48._16_4_;
              bVar6 = (bool)((byte)(uVar18 >> 5) & 1);
              auVar60._20_4_ = (uint)bVar6 * auVar58._20_4_ | (uint)!bVar6 * auVar48._20_4_;
              bVar6 = (bool)((byte)(uVar18 >> 6) & 1);
              auVar60._24_4_ = (uint)bVar6 * auVar58._24_4_ | (uint)!bVar6 * auVar48._24_4_;
              bVar6 = SUB81(uVar18 >> 7,0);
              auVar60._28_4_ = (uint)bVar6 * auVar58._28_4_ | (uint)!bVar6 * auVar48._28_4_;
              auVar48 = vminps_avx512vl(auVar54,auVar65);
              auVar67._0_4_ =
                   (uint)(bVar5 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar48._0_4_;
              bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
              auVar67._4_4_ = (uint)bVar6 * auVar54._4_4_ | (uint)!bVar6 * auVar48._4_4_;
              bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
              auVar67._8_4_ = (uint)bVar6 * auVar54._8_4_ | (uint)!bVar6 * auVar48._8_4_;
              bVar6 = (bool)((byte)(uVar18 >> 3) & 1);
              auVar67._12_4_ = (uint)bVar6 * auVar54._12_4_ | (uint)!bVar6 * auVar48._12_4_;
              bVar6 = (bool)((byte)(uVar18 >> 4) & 1);
              auVar67._16_4_ = (uint)bVar6 * auVar54._16_4_ | (uint)!bVar6 * auVar48._16_4_;
              bVar6 = (bool)((byte)(uVar18 >> 5) & 1);
              auVar67._20_4_ = (uint)bVar6 * auVar54._20_4_ | (uint)!bVar6 * auVar48._20_4_;
              bVar6 = (bool)((byte)(uVar18 >> 6) & 1);
              auVar67._24_4_ = (uint)bVar6 * auVar54._24_4_ | (uint)!bVar6 * auVar48._24_4_;
              bVar6 = SUB81(uVar18 >> 7,0);
              auVar67._28_4_ = (uint)bVar6 * auVar54._28_4_ | (uint)!bVar6 * auVar48._28_4_;
              auVar64 = vmaxps_avx512vl(auVar56,auVar64);
              auVar48._0_4_ =
                   (uint)(bVar5 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar64._0_4_;
              bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
              auVar48._4_4_ = (uint)bVar6 * auVar56._4_4_ | (uint)!bVar6 * auVar64._4_4_;
              bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
              auVar48._8_4_ = (uint)bVar6 * auVar56._8_4_ | (uint)!bVar6 * auVar64._8_4_;
              bVar6 = (bool)((byte)(uVar18 >> 3) & 1);
              auVar48._12_4_ = (uint)bVar6 * auVar56._12_4_ | (uint)!bVar6 * auVar64._12_4_;
              bVar6 = (bool)((byte)(uVar18 >> 4) & 1);
              auVar48._16_4_ = (uint)bVar6 * auVar56._16_4_ | (uint)!bVar6 * auVar64._16_4_;
              bVar6 = (bool)((byte)(uVar18 >> 5) & 1);
              auVar48._20_4_ = (uint)bVar6 * auVar56._20_4_ | (uint)!bVar6 * auVar64._20_4_;
              bVar6 = (bool)((byte)(uVar18 >> 6) & 1);
              auVar48._24_4_ = (uint)bVar6 * auVar56._24_4_ | (uint)!bVar6 * auVar64._24_4_;
              bVar6 = SUB81(uVar18 >> 7,0);
              auVar48._28_4_ = (uint)bVar6 * auVar56._28_4_ | (uint)!bVar6 * auVar64._28_4_;
              auVar62 = vmaxps_avx512vl(auVar59,auVar62);
              auVar64._0_4_ =
                   (uint)(bVar5 & 1) * auVar59._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar62._0_4_;
              bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
              auVar64._4_4_ = (uint)bVar6 * auVar59._4_4_ | (uint)!bVar6 * auVar62._4_4_;
              bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
              auVar64._8_4_ = (uint)bVar6 * auVar59._8_4_ | (uint)!bVar6 * auVar62._8_4_;
              bVar6 = (bool)((byte)(uVar18 >> 3) & 1);
              auVar64._12_4_ = (uint)bVar6 * auVar59._12_4_ | (uint)!bVar6 * auVar62._12_4_;
              bVar6 = (bool)((byte)(uVar18 >> 4) & 1);
              auVar64._16_4_ = (uint)bVar6 * auVar59._16_4_ | (uint)!bVar6 * auVar62._16_4_;
              bVar6 = (bool)((byte)(uVar18 >> 5) & 1);
              auVar64._20_4_ = (uint)bVar6 * auVar59._20_4_ | (uint)!bVar6 * auVar62._20_4_;
              bVar6 = (bool)((byte)(uVar18 >> 6) & 1);
              auVar64._24_4_ = (uint)bVar6 * auVar59._24_4_ | (uint)!bVar6 * auVar62._24_4_;
              bVar6 = SUB81(uVar18 >> 7,0);
              auVar64._28_4_ = (uint)bVar6 * auVar59._28_4_ | (uint)!bVar6 * auVar62._28_4_;
              auVar54 = vmaxps_avx512vl(auVar55,auVar65);
              auVar62._0_4_ =
                   (uint)(bVar5 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar54._0_4_;
              bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
              auVar62._4_4_ = (uint)bVar6 * auVar55._4_4_ | (uint)!bVar6 * auVar54._4_4_;
              bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
              auVar62._8_4_ = (uint)bVar6 * auVar55._8_4_ | (uint)!bVar6 * auVar54._8_4_;
              bVar6 = (bool)((byte)(uVar18 >> 3) & 1);
              auVar62._12_4_ = (uint)bVar6 * auVar55._12_4_ | (uint)!bVar6 * auVar54._12_4_;
              bVar6 = (bool)((byte)(uVar18 >> 4) & 1);
              auVar62._16_4_ = (uint)bVar6 * auVar55._16_4_ | (uint)!bVar6 * auVar54._16_4_;
              bVar6 = (bool)((byte)(uVar18 >> 5) & 1);
              auVar62._20_4_ = (uint)bVar6 * auVar55._20_4_ | (uint)!bVar6 * auVar54._20_4_;
              bVar6 = (bool)((byte)(uVar18 >> 6) & 1);
              auVar62._24_4_ = (uint)bVar6 * auVar55._24_4_ | (uint)!bVar6 * auVar54._24_4_;
              bVar6 = SUB81(uVar18 >> 7,0);
              auVar62._28_4_ = (uint)bVar6 * auVar55._28_4_ | (uint)!bVar6 * auVar54._28_4_;
              auVar54 = vmaxps_avx512vl(auVar88._0_32_,auVar65);
              auVar55._0_4_ =
                   (uint)(bVar5 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar54._0_4_;
              bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
              auVar55._4_4_ = (uint)bVar6 * auVar88._4_4_ | (uint)!bVar6 * auVar54._4_4_;
              bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
              auVar55._8_4_ = (uint)bVar6 * auVar88._8_4_ | (uint)!bVar6 * auVar54._8_4_;
              bVar6 = (bool)((byte)(uVar18 >> 3) & 1);
              auVar55._12_4_ = (uint)bVar6 * auVar88._12_4_ | (uint)!bVar6 * auVar54._12_4_;
              bVar6 = (bool)((byte)(uVar18 >> 4) & 1);
              auVar55._16_4_ = (uint)bVar6 * auVar88._16_4_ | (uint)!bVar6 * auVar54._16_4_;
              bVar6 = (bool)((byte)(uVar18 >> 5) & 1);
              auVar55._20_4_ = (uint)bVar6 * auVar88._20_4_ | (uint)!bVar6 * auVar54._20_4_;
              bVar6 = (bool)((byte)(uVar18 >> 6) & 1);
              auVar55._24_4_ = (uint)bVar6 * auVar88._24_4_ | (uint)!bVar6 * auVar54._24_4_;
              bVar6 = SUB81(uVar18 >> 7,0);
              auVar55._28_4_ = (uint)bVar6 * auVar88._28_4_ | (uint)!bVar6 * auVar54._28_4_;
              in_ZMM23 = ZEXT3264(auVar55);
              uVar33 = uVar33 + 8;
              auVar88 = ZEXT3264(auVar55);
              auVar54 = auVar67;
              auVar55 = auVar62;
              auVar56 = auVar48;
              auVar57 = auVar61;
              auVar58 = auVar60;
              auVar59 = auVar64;
            } while (uVar33 <= uVar30);
          }
          auVar66 = vshufps_avx512vl(auVar61,auVar61,0xb1);
          auVar66 = vminps_avx512vl(auVar61,auVar66);
          auVar61 = vshufpd_avx(auVar66,auVar66,5);
          auVar61 = vminps_avx(auVar66,auVar61);
          auVar34 = vminps_avx(auVar61._0_16_,auVar61._16_16_);
          auVar61 = vshufps_avx(auVar60,auVar60,0xb1);
          auVar60 = vminps_avx(auVar60,auVar61);
          auVar61 = vshufpd_avx(auVar60,auVar60,5);
          auVar60 = vminps_avx(auVar60,auVar61);
          auVar35 = vminps_avx(auVar60._0_16_,auVar60._16_16_);
          auVar35 = vunpcklps_avx(auVar34,auVar35);
          auVar60 = vshufps_avx512vl(auVar67,auVar67,0xb1);
          auVar60 = vminps_avx512vl(auVar67,auVar60);
          auVar67 = vshufpd_avx(auVar60,auVar60,5);
          auVar67 = vminps_avx(auVar60,auVar67);
          auVar34 = vminps_avx(auVar67._0_16_,auVar67._16_16_);
          auVar34 = vinsertps_avx(auVar35,auVar34,0x28);
          auVar67 = vshufps_avx512vl(auVar48,auVar48,0xb1);
          auVar67 = vmaxps_avx512vl(auVar48,auVar67);
          auVar48 = vshufpd_avx(auVar67,auVar67,5);
          auVar48 = vmaxps_avx(auVar67,auVar48);
          auVar35 = vmaxps_avx(auVar48._0_16_,auVar48._16_16_);
          auVar48 = vshufps_avx512vl(auVar64,auVar64,0xb1);
          auVar67 = vmaxps_avx512vl(auVar64,auVar48);
          auVar48 = vshufpd_avx(auVar67,auVar67,5);
          auVar48 = vmaxps_avx(auVar67,auVar48);
          auVar47 = vmaxps_avx(auVar48._0_16_,auVar48._16_16_);
          auVar47 = vunpcklps_avx(auVar35,auVar47);
          auVar48 = vshufps_avx512vl(auVar62,auVar62,0xb1);
          auVar67 = vmaxps_avx512vl(auVar62,auVar48);
          auVar48 = vshufpd_avx(auVar67,auVar67,5);
          auVar48 = vmaxps_avx(auVar67,auVar48);
          auVar35 = vmaxps_avx(auVar48._0_16_,auVar48._16_16_);
          auVar35 = vinsertps_avx(auVar47,auVar35,0x28);
          auVar67 = in_ZMM23._0_32_;
          auVar48 = vshufps_avx512vl(auVar67,auVar67,0xb1);
          auVar67 = vmaxps_avx512vl(auVar67,auVar48);
          auVar48 = vshufpd_avx(auVar67,auVar67,5);
          auVar48 = vmaxps_avx(auVar67,auVar48);
          auVar47 = vmaxps_avx(auVar48._0_16_,auVar48._16_16_);
          fVar72 = auVar47._0_4_;
          auVar36._4_4_ = fVar72;
          auVar36._0_4_ = fVar72;
          auVar36._8_4_ = fVar72;
          auVar36._12_4_ = fVar72;
          auVar34 = vsubps_avx(auVar34,auVar36);
          auVar46._0_4_ = auVar35._0_4_ + fVar72;
          auVar46._4_4_ = auVar35._4_4_ + fVar72;
          auVar46._8_4_ = auVar35._8_4_ + fVar72;
          auVar46._12_4_ = auVar35._12_4_ + fVar72;
        }
        auVar35 = vandps_avx512vl(auVar34,auVar92._0_16_);
        auVar47 = vandps_avx512vl(auVar46,auVar92._0_16_);
        auVar35 = vmaxps_avx(auVar35,auVar47);
        auVar47 = vmovshdup_avx(auVar35);
        auVar47 = vmaxss_avx(auVar47,auVar35);
        auVar35 = vshufpd_avx(auVar35,auVar35,1);
        auVar35 = vmaxss_avx(auVar35,auVar47);
        fVar72 = auVar35._0_4_ * 4.7683716e-07;
        auVar35._4_4_ = fVar72;
        auVar35._0_4_ = fVar72;
        auVar35._8_4_ = fVar72;
        auVar35._12_4_ = fVar72;
        auVar34 = vsubps_avx(auVar34,auVar35);
        aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar34,ZEXT416(geomID),0x30);
        auVar34._0_4_ = auVar46._0_4_ + fVar72;
        auVar34._4_4_ = auVar46._4_4_ + fVar72;
        auVar34._8_4_ = auVar46._8_4_ + fVar72;
        auVar34._12_4_ = auVar46._12_4_ + fVar72;
        aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar34,ZEXT416((uint)uVar28),0x30);
        auVar34 = vminps_avx(auVar71._0_16_,(undefined1  [16])aVar9);
        auVar71 = ZEXT1664(auVar34);
        auVar34 = vmaxps_avx512vl(auVar90._0_16_,(undefined1  [16])aVar10);
        auVar90 = ZEXT1664(auVar34);
        auVar83._0_4_ = aVar9.x + aVar10.x;
        auVar83._4_4_ = aVar9.y + aVar10.y;
        auVar83._8_4_ = aVar9.z + aVar10.z;
        auVar83._12_4_ = aVar9.field_3.w + aVar10.field_3.w;
        auVar34 = vminps_avx(auVar77._0_16_,auVar83);
        auVar77 = ZEXT1664(auVar34);
        auVar34 = vmaxps_avx(auVar80._0_16_,auVar83);
        auVar80 = ZEXT1664(auVar34);
        local_250 = local_250 + 1;
        prims[local_248].upper.field_0.field_1 = aVar10;
        prims[local_248].lower.field_0.field_1 = aVar9;
        uVar26 = r->_end;
        local_248 = local_248 + 1;
      }
LAB_01edcd42:
      aVar78 = auVar80._0_16_;
      aVar75 = auVar77._0_16_;
      aVar79 = auVar90._0_16_;
      aVar76 = auVar71._0_16_;
      uVar28 = uVar28 + 1;
    } while (uVar28 < uVar26);
  }
  else {
    aVar76.m128[2] = INFINITY;
    aVar76._0_8_ = 0x7f8000007f800000;
    aVar76.m128[3] = INFINITY;
    aVar79.m128[2] = -INFINITY;
    aVar79._0_8_ = 0xff800000ff800000;
    aVar79.m128[3] = -INFINITY;
    local_250 = 0;
    aVar75 = aVar76;
    aVar78 = aVar79;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar76;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar79;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar75;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar78;
  __return_storage_ptr__->end = local_250;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }